

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageSamplingInstance.cpp
# Opt level: O0

MovePtr<tcu::Texture2DView,_de::DefaultDeleter<tcu::Texture2DView>_> *
vkt::pipeline::anon_unknown_0::getTexture2DView
          (MovePtr<tcu::Texture2DView,_de::DefaultDeleter<tcu::Texture2DView>_>
           *__return_storage_ptr__,TestTexture *testTexture,VkImageSubresourceRange *subresource,
          vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *levels)

{
  int iVar1;
  int width;
  int height;
  size_type sVar2;
  undefined4 extraout_var;
  TextureLevelPyramid *this;
  reference pvVar3;
  Texture2DView *this_00;
  ConstPixelBufferAccess *local_c0;
  long *local_b0;
  TestTexture2DArray *local_a0;
  DefaultDeleter<tcu::Texture2DView> local_7d [13];
  ConstPixelBufferAccess local_70;
  ConstPixelBufferAccess *local_48;
  ConstPixelBufferAccess *srcLevel;
  long *plStack_38;
  int levelNdx;
  TestTexture2DArray *tex2DArray;
  TestTexture2D *tex2D;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *levels_local;
  VkImageSubresourceRange *subresource_local;
  TestTexture *testTexture_local;
  
  tex2D = (TestTexture2D *)levels;
  levels_local = (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                  *)subresource;
  subresource_local = (VkImageSubresourceRange *)testTexture;
  testTexture_local = (TestTexture *)__return_storage_ptr__;
  if (testTexture == (TestTexture *)0x0) {
    local_a0 = (TestTexture2DArray *)0x0;
  }
  else {
    local_a0 = (TestTexture2DArray *)
               __dynamic_cast(testTexture,&TestTexture::typeinfo,&TestTexture2D::typeinfo,0);
  }
  tex2DArray = local_a0;
  if (subresource_local == (VkImageSubresourceRange *)0x0) {
    local_b0 = (long *)0x0;
  }
  else {
    local_b0 = (long *)__dynamic_cast(subresource_local,&TestTexture::typeinfo,
                                      &TestTexture2DArray::typeinfo,0);
  }
  plStack_38 = local_b0;
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::resize
            ((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
             tex2D,(ulong)*(uint *)&(levels_local->
                                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                    )._M_impl.super__Vector_impl_data._M_finish);
  srcLevel._4_4_ = 0;
  while( true ) {
    iVar1 = srcLevel._4_4_;
    sVar2 = std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
            size((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                  *)tex2D);
    if ((int)sVar2 <= iVar1) break;
    if (tex2DArray == (TestTexture2DArray *)0x0) {
      this = (TextureLevelPyramid *)(**(code **)(*plStack_38 + 0x80))();
      local_c0 = tcu::TextureLevelPyramid::getLevel
                           (this,*(int *)((long)&(levels_local->
                                                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                                 )._M_impl.super__Vector_impl_data._M_start + 4) +
                                 srcLevel._4_4_);
    }
    else {
      iVar1 = (*(tex2DArray->super_TestTexture)._vptr_TestTexture[0x10])();
      local_c0 = tcu::TextureLevelPyramid::getLevel
                           ((TextureLevelPyramid *)CONCAT44(extraout_var,iVar1),
                            *(int *)((long)&(levels_local->
                                            super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                            )._M_impl.super__Vector_impl_data._M_start + 4) +
                            srcLevel._4_4_);
    }
    local_48 = local_c0;
    iVar1 = *(int *)((long)&(levels_local->
                            super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                            )._M_impl.super__Vector_impl_data._M_finish + 4);
    width = tcu::ConstPixelBufferAccess::getWidth(local_c0);
    height = tcu::ConstPixelBufferAccess::getHeight(local_48);
    tcu::getSubregion(&local_70,local_c0,0,0,iVar1,width,height,1);
    pvVar3 = std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
             ::operator[]((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                           *)tex2D,(long)srcLevel._4_4_);
    memcpy(pvVar3,&local_70,0x28);
    srcLevel._4_4_ = srcLevel._4_4_ + 1;
  }
  this_00 = (Texture2DView *)operator_new(0x10);
  sVar2 = std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
          size((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
               tex2D);
  pvVar3 = std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
           operator[]((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                       *)tex2D,0);
  tcu::Texture2DView::Texture2DView(this_00,(int)sVar2,pvVar3);
  de::DefaultDeleter<tcu::Texture2DView>::DefaultDeleter(local_7d);
  de::details::MovePtr<tcu::Texture2DView,_de::DefaultDeleter<tcu::Texture2DView>_>::MovePtr
            (__return_storage_ptr__,this_00);
  return __return_storage_ptr__;
}

Assistant:

MovePtr<tcu::Texture2DView> getTexture2DView (const TestTexture& testTexture, const vk::VkImageSubresourceRange& subresource, std::vector<tcu::ConstPixelBufferAccess>& levels)
{
	const TestTexture2D*		tex2D		= dynamic_cast<const TestTexture2D*>(&testTexture);
	const TestTexture2DArray*	tex2DArray	= dynamic_cast<const TestTexture2DArray*>(&testTexture);

	DE_ASSERT(subresource.layerCount == 1);
	DE_ASSERT(!!tex2D != !!tex2DArray);
	DE_ASSERT(tex2DArray || subresource.baseArrayLayer == 0);

	levels.resize(subresource.levelCount);

	for (int levelNdx = 0; levelNdx < (int)levels.size(); ++levelNdx)
	{
		const tcu::ConstPixelBufferAccess& srcLevel = tex2D ? tex2D->getTexture().getLevel((int)subresource.baseMipLevel+levelNdx)
															: tex2DArray->getTexture().getLevel((int)subresource.baseMipLevel+levelNdx);

		levels[levelNdx] = tcu::getSubregion(srcLevel, 0, 0, (int)subresource.baseArrayLayer, srcLevel.getWidth(), srcLevel.getHeight(), 1);
	}

	return MovePtr<tcu::Texture2DView>(new tcu::Texture2DView((int)levels.size(), &levels[0]));
}